

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgParser.cpp
# Opt level: O3

void __thiscall ArgParser::ArgParser(ArgParser *this,int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  uint uVar7;
  double dVar8;
  
  (this->input_file)._M_dataplus._M_p = (pointer)&(this->input_file).field_2;
  (this->input_file)._M_string_length = 0;
  (this->input_file).field_2._M_local_buf[0] = '\0';
  (this->output_file)._M_dataplus._M_p = (pointer)&(this->output_file).field_2;
  (this->output_file)._M_string_length = 0;
  (this->output_file).field_2._M_local_buf[0] = '\0';
  (this->log_file)._M_dataplus._M_p = (pointer)&(this->log_file).field_2;
  (this->log_file)._M_string_length = 0;
  (this->log_file).field_2._M_local_buf[0] = '\0';
  defaultValues(this);
  if (1 < argc) {
    uVar7 = 1;
    do {
      pcVar1 = argv[(int)uVar7];
      iVar3 = strcmp(pcVar1,"-input");
      if (iVar3 == 0) {
        iVar3 = uVar7 + 1;
        if (argc <= iVar3) {
          __assert_fail("i < argc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/ArgParser.cpp"
                        ,0x10,"ArgParser::ArgParser(int, const char **)");
        }
        pcVar1 = argv[iVar3];
        pcVar2 = (char *)(this->input_file)._M_string_length;
        strlen(pcVar1);
        std::__cxx11::string::_M_replace((ulong)this,0,pcVar2,(ulong)pcVar1);
      }
      else {
        iVar3 = strcmp(pcVar1,"-output");
        if (iVar3 == 0) {
          iVar3 = uVar7 + 1;
          if (argc <= iVar3) {
            __assert_fail("i < argc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/ArgParser.cpp"
                          ,0x14,"ArgParser::ArgParser(int, const char **)");
          }
          pcVar1 = argv[iVar3];
          pcVar2 = (char *)(this->output_file)._M_string_length;
          strlen(pcVar1);
          std::__cxx11::string::_M_replace((ulong)&this->output_file,0,pcVar2,(ulong)pcVar1);
        }
        else {
          iVar3 = strcmp(pcVar1,"-size");
          if (iVar3 == 0) {
            if (argc <= (int)(uVar7 + 1)) {
              __assert_fail("i < argc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/ArgParser.cpp"
                            ,0x18,"ArgParser::ArgParser(int, const char **)");
            }
            iVar3 = atoi(argv[(int)(uVar7 + 1)]);
            this->width = iVar3;
            iVar3 = uVar7 + 2;
            if (argc <= iVar3) {
              __assert_fail("i < argc",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/ArgParser.cpp"
                            ,0x1b,"ArgParser::ArgParser(int, const char **)");
            }
            iVar4 = atoi(argv[iVar3]);
            this->height = iVar4;
          }
          else {
            iVar3 = strcmp(pcVar1,"-iters");
            if (iVar3 == 0) {
              iVar3 = uVar7 + 1;
              if (argc <= iVar3) {
                __assert_fail("i < argc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/ArgParser.cpp"
                              ,0x22,"ArgParser::ArgParser(int, const char **)");
              }
              iVar4 = atoi(argv[iVar3]);
              this->iters = iVar4;
            }
            else {
              iVar3 = strcmp(pcVar1,"-length");
              if (iVar3 == 0) {
                iVar3 = uVar7 + 1;
                if (argc <= iVar3) {
                  __assert_fail("i < argc",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/ArgParser.cpp"
                                ,0x26,"ArgParser::ArgParser(int, const char **)");
                }
                dVar8 = atof(argv[iVar3]);
                this->length = (float)dVar8;
              }
              else {
                iVar3 = strcmp(pcVar1,"-log");
                if (iVar3 != 0) {
                  printf("Unknown command line argument %d: \'%s\'\n",(ulong)uVar7,pcVar1);
                  exit(1);
                }
                iVar3 = uVar7 + 1;
                if (argc <= iVar3) {
                  __assert_fail("i < argc",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/ArgParser.cpp"
                                ,0x2d,"ArgParser::ArgParser(int, const char **)");
                }
                pcVar1 = argv[iVar3];
                pcVar2 = (char *)(this->log_file)._M_string_length;
                strlen(pcVar1);
                std::__cxx11::string::_M_replace((ulong)&this->log_file,0,pcVar2,(ulong)pcVar1);
              }
            }
          }
        }
      }
      uVar7 = iVar3 + 1;
    } while ((int)uVar7 < argc);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Args:\n",6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- input: ",9);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->input_file)._M_dataplus._M_p,
                      (this->input_file)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- output: ",10);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->output_file)._M_dataplus._M_p,
                      (this->output_file)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- width: ",9);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->width);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- height: ",10);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->height);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- iters: ",9);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->iters);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- length: ",10);
  poVar5 = std::ostream::_M_insert<double>((double)this->length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"- log: ",7);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->log_file)._M_dataplus._M_p,
                      (this->log_file)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return;
}

Assistant:

ArgParser::ArgParser(int argc, const char *argv[]) {
    defaultValues();

    for (int i = 1; i < argc; i++) {
        // rendering output
        if (!strcmp(argv[i], "-input")) {
            i++;
            assert (i < argc);
            input_file = argv[i];
        } else if (!strcmp(argv[i], "-output")) {
            i++;
            assert (i < argc);
            output_file = argv[i];
        } else if (!strcmp(argv[i], "-size")) {
            i++;
            assert (i < argc);
            width = atoi(argv[i]);
            i++;
            assert (i < argc);
            height = atoi(argv[i]);
        }

        // rendering options
        else if (!strcmp(argv[i], "-iters")) {
            i++;
            assert (i < argc);
            iters = atoi(argv[i]);
        } else if (!strcmp(argv[i], "-length")) {
            i++;
            assert (i < argc);
            length = atof(argv[i]);
        }

        // logging
        else if (!strcmp(argv[i], "-log")) {
            i++;
            assert (i < argc);
            log_file = argv[i];
        }

        // Unknown argument.
        else {
            printf("Unknown command line argument %d: '%s'\n", i, argv[i]);
            exit(1);
        }
    }

    std::cout << "Args:\n";
    std::cout << "- input: " << input_file << std::endl;
    std::cout << "- output: " << output_file << std::endl;
    std::cout << "- width: " << width << std::endl;
    std::cout << "- height: " << height << std::endl;
    std::cout << "- iters: " << iters << std::endl;
    std::cout << "- length: " << length << std::endl;
    std::cout << "- log: " << log_file << std::endl;
}